

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O0

void NULLCDynamic::Override(NULLCRef dest,NULLCArray code)

{
  uint sourceId;
  ExternMemberInfo *pEVar1;
  nullres nVar2;
  int iVar3;
  uint uVar4;
  ExternTypeInfo *pEVar5;
  char *pcVar6;
  char *pcVar7;
  FastVector<ExternMemberInfo,_false,_false> *this;
  char *pcVar8;
  char *local_850;
  char *bytecode;
  uint memberCount;
  uint i;
  ExternTypeInfo *returnType;
  ExternMemberInfo *memberList;
  char *it;
  char tmp [2048];
  NULLCArray code_local;
  
  pcVar7 = code.ptr;
  unique0x1000037f = pcVar7;
  if (linker != 0) {
    pEVar5 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
    if (pEVar5->subCat == CAT_FUNCTION) {
      memberList = (ExternMemberInfo *)&it;
      this = (FastVector<ExternMemberInfo,_false,_false> *)(linker + 0x210);
      pEVar5 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
      returnType = (ExternTypeInfo *)
                   FastVector<ExternMemberInfo,_false,_false>::operator[]
                             (this,(pEVar5->field_11).subType);
      _memberCount = FastVector<ExternTypeInfo,_false,_false>::operator[]
                               ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                                returnType->offsetToName);
      pEVar1 = memberList;
      iVar3 = (int)memberList;
      pcVar6 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),0);
      iVar3 = NULLC::SafeSprintf((char *)pEVar1,(long)(0x800 - (iVar3 - (int)&it)),
                                 "import __last;\r\n%s __override%d(",
                                 pcVar6 + _memberCount->offsetToName,(ulong)Override::overrideID);
      memberList = (ExternMemberInfo *)((long)&memberList->type + (long)iVar3);
      bytecode._4_4_ = 0;
      pEVar5 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
      bytecode._0_4_ = (pEVar5->field_8).arrSize;
      for (; pEVar1 = memberList, iVar3 = (int)memberList, bytecode._4_4_ != (uint)bytecode;
          bytecode._4_4_ = bytecode._4_4_ + 1) {
        pcVar6 = FastVector<char,_false,_false>::operator[]
                           ((FastVector<char,_false,_false> *)(linker + 0x290),0);
        pEVar5 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                           ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                            (&returnType->offsetToName)[(ulong)(bytecode._4_4_ + 1) * 3]);
        pcVar8 = ", ";
        if (bytecode._4_4_ == (uint)bytecode - 1) {
          pcVar8 = "";
        }
        iVar3 = NULLC::SafeSprintf((char *)pEVar1,(long)(0x800 - (iVar3 - (int)&it)),"%s arg%d%s",
                                   pcVar6 + pEVar5->offsetToName,(ulong)bytecode._4_4_,pcVar8);
        memberList = (ExternMemberInfo *)((long)&memberList->type + (long)iVar3);
      }
      iVar3 = NULLC::SafeSprintf((char *)memberList,(long)(0x800 - (iVar3 - (int)&it)),"){ %s }",
                                 pcVar7);
      memberList = (ExternMemberInfo *)((long)&memberList->type + (long)iVar3);
      Override::overrideID = Override::overrideID + 1;
      nVar2 = nullcCompile((char *)&it);
      if (nVar2 == '\0') {
        pcVar7 = nullcGetLastError();
        nullcThrowError("%s",pcVar7);
      }
      else {
        local_850 = (char *)0x0;
        nullcGetBytecodeNoCache(&local_850);
        nVar2 = nullcLinkCode(local_850);
        if (nVar2 == '\0') {
          if (local_850 != (char *)0x0) {
            operator_delete__(local_850);
          }
          pcVar7 = nullcGetLastError();
          nullcThrowError("%s",pcVar7);
        }
        else {
          if (local_850 != (char *)0x0) {
            operator_delete__(local_850);
          }
          sourceId = *(uint *)(dest.ptr + 8);
          uVar4 = FastVector<ExternFuncInfo,_false,_false>::size
                            ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240));
          nullcRedirectFunction(sourceId,uVar4 - 1);
        }
      }
    }
    else {
      nullcThrowError("Destination variable is not a function");
    }
    return;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/dynamic.cpp"
                ,0x25,"void NULLCDynamic::Override(NULLCRef, NULLCArray)");
}

Assistant:

void Override(NULLCRef dest, NULLCArray code)
	{
		assert(linker);
		static unsigned int overrideID = 0;

		if(linker->exTypes[dest.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Destination variable is not a function");
			return;
		}

		char tmp[2048];
		char *it = tmp;
		ExternMemberInfo *memberList = &linker->exTypeExtra[linker->exTypes[dest.typeID].memberOffset];
		ExternTypeInfo &returnType = linker->exTypes[memberList[0].type];
		it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "import __last;\r\n%s __override%d(", &linker->exSymbols[0] + returnType.offsetToName, overrideID);

		for(unsigned int i = 0, memberCount = linker->exTypes[dest.typeID].memberCount; i != memberCount; i++)
			it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "%s arg%d%s", &linker->exSymbols[0] + linker->exTypes[memberList[i + 1].type].offsetToName, i, i == memberCount - 1 ? "" : ", ");
		it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "){ %s }", code.ptr);
		overrideID++;

		if(!nullcCompile(tmp))
		{
			nullcThrowError("%s", nullcGetLastError());
			return;
		}
		char *bytecode = NULL;
		nullcGetBytecodeNoCache(&bytecode);
		if(!nullcLinkCode(bytecode))
		{
			delete[] bytecode;
			nullcThrowError("%s", nullcGetLastError());
			return;
		}
		delete[] bytecode;

		nullcRedirectFunction(((NULLCFuncPtr*)dest.ptr)->id, linker->exFunctions.size() - 1);
	}